

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::predict_or_learn_cover<false>(cb_explore *data,single_learner *base,example *ec)

{
  label *this;
  uint32_t uVar1;
  label_t lVar2;
  cb_class *pcVar3;
  size_t sVar4;
  wclass *pwVar5;
  wclass *pwVar6;
  uint32_t uVar7;
  wclass local_68;
  action_scores probs;
  
  uVar1 = (data->cbcs).num_actions;
  probs._begin = (ec->pred).a_s._begin;
  probs._end = (ec->pred).a_s._end;
  probs.end_array = (ec->pred).a_s.end_array;
  probs.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&probs);
  this = &data->cs_label;
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  for (uVar7 = 1; uVar7 - uVar1 != 1; uVar7 = uVar7 + 1) {
    local_68.x = 3.4028235e+38;
    local_68.partial_prediction = 0.0;
    local_68.wap_value = 0.0;
    base = (single_learner *)&local_68;
    local_68.class_index = uVar7;
    v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_68);
  }
  lVar2 = (ec->l).multi;
  pcVar3 = (cb_class *)(ec->l).cs.costs._end;
  sVar4 = (ec->l).cs.costs.erase_count;
  (data->cb_label).costs.end_array = (cb_class *)(ec->l).cs.costs.end_array;
  (data->cb_label).costs.erase_count = sVar4;
  (data->cb_label).costs._begin = (cb_class *)lVar2;
  (data->cb_label).costs._end = pcVar3;
  pwVar5 = (data->cs_label).costs._end;
  pwVar6 = (data->cs_label).costs.end_array;
  sVar4 = (data->cs_label).costs.erase_count;
  (ec->l).multi = (label_t)(this->costs)._begin;
  (ec->l).cs.costs._end = pwVar5;
  (ec->l).cs.costs.end_array = pwVar6;
  (ec->l).cs.costs.erase_count = sVar4;
  get_cover_probabilities(data,base,ec,&probs);
  lVar2 = (label_t)(data->cb_label).costs._begin;
  pcVar3 = (data->cb_label).costs._end;
  sVar4 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar4;
  (ec->l).multi = lVar2;
  (ec->l).cs.costs._end = (wclass *)pcVar3;
  (ec->pred).a_s.end_array = probs.end_array;
  (ec->pred).scalars.erase_count = probs.erase_count;
  (ec->pred).a_s._begin = probs._begin;
  (ec->pred).a_s._end = probs._end;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.

  uint32_t num_actions = data.cbcs.num_actions;

  action_scores probs = ec.pred.a_s;
  probs.clear();
  data.cs_label.costs.clear();

  for (uint32_t j = 0; j < num_actions; j++) data.cs_label.costs.push_back({FLT_MAX, j + 1, 0., 0.});

  size_t cover_size = data.cover_size;
  size_t counter = data.counter;
  v_array<float>& probabilities = data.cover_probs;
  v_array<uint32_t>& predictions = data.preds;

  float additive_probability = 1.f / (float)cover_size;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(counter * num_actions));

  data.cb_label = ec.l.cb;

  ec.l.cs = data.cs_label;
  get_cover_probabilities(data, base, ec, probs);

  if (is_learn)
  {
    ec.l.cb = data.cb_label;
    base.learn(ec);

    // Now update oracles

    // 1. Compute loss vector
    data.cs_label.costs.clear();
    float norm = min_prob * num_actions;
    ec.l.cb = data.cb_label;
    data.cbcs.known_cost = get_observed_cost(data.cb_label);
    gen_cs_example<false>(data.cbcs, ec, data.cb_label, data.cs_label);
    for (uint32_t i = 0; i < num_actions; i++) probabilities[i] = 0;

    ec.l.cs = data.second_cs_label;
    // 2. Update functions
    for (size_t i = 0; i < cover_size; i++)
    {
      // Create costs of each action based on online cover
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_label.costs[j].x - data.psi * min_prob / (max(probabilities[j], min_prob) / norm) + 1;
        data.second_cs_label.costs[j].class_index = j + 1;
        data.second_cs_label.costs[j].x = pseudo_cost;
      }
      if (i != 0)
        data.cs->learn(ec, i + 1);
      if (probabilities[predictions[i] - 1] < min_prob)
        norm += max(0, additive_probability - (min_prob - probabilities[predictions[i] - 1]));
      else
        norm += additive_probability;
      probabilities[predictions[i] - 1] += additive_probability;
    }
  }

  ec.l.cb = data.cb_label;
  ec.pred.a_s = probs;
}